

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonLibTests_Marshall.c
# Opt level: O2

WJTL_STATUS TestMarshallArrayStrings(void)

{
  WJTL_STATUS WVar1;
  WJTL_STATUS WVar2;
  WJTL_STATUS WVar3;
  WJTL_STATUS WVar4;
  WJTL_STATUS WVar5;
  JlMarshallElement marshalStringStruct [2];
  StringStruct theStruct;
  char *someStrings [10];
  
  memcpy(marshalStringStruct,&DAT_00141a70,0xc0);
  theStruct.ArrayStrFixedCount = 0;
  theStruct.StrArray = (char **)0x0;
  theStruct.StrArrayCount = 0;
  theStruct.ArrayStrFixed[2] = (char *)0x0;
  theStruct.ArrayStrFixed[3] = (char *)0x0;
  theStruct.ArrayStrFixed[0] = (char *)0x0;
  theStruct.ArrayStrFixed[1] = (char *)0x0;
  someStrings[8] = (char *)0x0;
  someStrings[9] = (char *)0x0;
  someStrings[6] = (char *)0x0;
  someStrings[7] = (char *)0x0;
  someStrings[4] = (char *)0x0;
  someStrings[5] = (char *)0x0;
  someStrings[2] = (char *)0x0;
  someStrings[3] = (char *)0x0;
  someStrings[0] = (char *)0x0;
  someStrings[1] = (char *)0x0;
  WVar1 = MakeJsonAndVerify(&theStruct,marshalStringStruct,2,
                            "{\"ArrayStrFixed\":[],\"StrArray\":[]}");
  WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(MakeJsonAndVerify( &theStruct, marshalStringStruct, ( sizeof(marshalStringStruct) / sizeof((marshalStringStruct)[0]) ), \"{\\\"ArrayStrFixed\\\":[],\\\"StrArray\\\":[]}\" ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Marshall.c"
                   ,"TestMarshallArrayStrings",0xc4);
  theStruct.ArrayStrFixed[0] = (char *)0x0;
  theStruct.ArrayStrFixedCount = 1;
  theStruct.StrArrayCount = 1;
  theStruct.StrArray = someStrings;
  WVar2 = MakeJsonAndVerify(&theStruct,marshalStringStruct,2,
                            "{\"ArrayStrFixed\":[null],\"StrArray\":[null]}");
  WjTestLib_Assert(WVar2 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(MakeJsonAndVerify( &theStruct, marshalStringStruct, ( sizeof(marshalStringStruct) / sizeof((marshalStringStruct)[0]) ), \"{\\\"ArrayStrFixed\\\":[null],\\\"StrArray\\\":[null]}\" ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Marshall.c"
                   ,"TestMarshallArrayStrings",0xcd);
  theStruct.ArrayStrFixed[0] = anon_var_dwarf_425 + 10;
  theStruct.ArrayStrFixedCount = 1;
  someStrings[0] = anon_var_dwarf_425 + 10;
  theStruct.StrArrayCount = 1;
  theStruct.StrArray = someStrings;
  WVar3 = MakeJsonAndVerify(&theStruct,marshalStringStruct,2,
                            "{\"ArrayStrFixed\":[null],\"StrArray\":[null]}");
  WjTestLib_Assert(WVar3 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(MakeJsonAndVerify( &theStruct, marshalStringStruct, ( sizeof(marshalStringStruct) / sizeof((marshalStringStruct)[0]) ), \"{\\\"ArrayStrFixed\\\":[null],\\\"StrArray\\\":[null]}\" ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Marshall.c"
                   ,"TestMarshallArrayStrings",0xd7);
  theStruct.ArrayStrFixed[0] = "a";
  theStruct.ArrayStrFixed[1] = "b";
  theStruct.ArrayStrFixed[2] = "c";
  theStruct.ArrayStrFixedCount = 3;
  someStrings[0] = "A";
  someStrings[1] = "B";
  someStrings[2] = "C";
  theStruct.StrArrayCount = 3;
  theStruct.StrArray = someStrings;
  WVar4 = MakeJsonAndVerify(&theStruct,marshalStringStruct,2,
                            "{\"ArrayStrFixed\":[\"a\",\"b\",\"c\"],\"StrArray\":[\"A\",\"B\",\"C\"]}"
                           );
  WjTestLib_Assert(WVar4 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(MakeJsonAndVerify( &theStruct, marshalStringStruct, ( sizeof(marshalStringStruct) / sizeof((marshalStringStruct)[0]) ), \"{\\\"ArrayStrFixed\\\":[\\\"a\\\",\\\"b\\\",\\\"c\\\"],\\\"StrArray\\\":[\\\"A\\\",\\\"B\\\",\\\"C\\\"]}\" ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Marshall.c"
                   ,"TestMarshallArrayStrings",0xe5);
  WVar5 = WJTL_STATUS_FAILED;
  if (((WVar2 == WJTL_STATUS_SUCCESS && WVar1 == WJTL_STATUS_SUCCESS) &&
      WVar3 == WJTL_STATUS_SUCCESS) && WVar4 == WJTL_STATUS_SUCCESS) {
    WVar5 = WJTL_STATUS_SUCCESS;
  }
  return WVar5;
}

Assistant:

static
WJTL_STATUS
    TestMarshallArrayStrings
    (
        void
    )
{
    WJTL_STATUS TestReturn = WJTL_STATUS_SUCCESS;

    typedef struct
    {
        char* ArrayStrFixed[4];
        size_t ArrayStrFixedCount;
        char** StrArray;
        size_t StrArrayCount;
    } StringStruct;

    JlMarshallElement marshalStringStruct[] =
    {
        JlMarshallStringFixedArray( StringStruct, ArrayStrFixed, ArrayStrFixedCount, "ArrayStrFixed" ),
        JlMarshallStringArray( StringStruct, StrArray, StrArrayCount, "StrArray" ),
    };

    StringStruct theStruct = {{0}};
    char* someStrings[10] = {0};
//    char* jsonString = NULL;

    // Check marshalling empty arrays
    JL_ASSERT_SUCCESS( MakeJsonAndVerify( &theStruct, marshalStringStruct, NumElements(marshalStringStruct),
                                          "{\"ArrayStrFixed\":[],\"StrArray\":[]}" ) );

    // Now try with arrays containing only a single NULL string
    theStruct.ArrayStrFixed[0] = NULL;
    theStruct.ArrayStrFixedCount = 1;
    theStruct.StrArray = someStrings;
    theStruct.StrArrayCount = 1;

    JL_ASSERT_SUCCESS( MakeJsonAndVerify( &theStruct, marshalStringStruct, NumElements(marshalStringStruct),
                                          "{\"ArrayStrFixed\":[null],\"StrArray\":[null]}" ) );

    // Now try with arrays containing only a single empty string
    theStruct.ArrayStrFixed[0] = "";
    theStruct.ArrayStrFixedCount = 1;
    someStrings[0] = "";
    theStruct.StrArray = someStrings;
    theStruct.StrArrayCount = 1;

    JL_ASSERT_SUCCESS( MakeJsonAndVerify( &theStruct, marshalStringStruct, NumElements(marshalStringStruct),
                                          "{\"ArrayStrFixed\":[null],\"StrArray\":[null]}" ) );

    // Now try regular strings
    theStruct.ArrayStrFixed[0] = "a";
    theStruct.ArrayStrFixed[1] = "b";
    theStruct.ArrayStrFixed[2] = "c";
    theStruct.ArrayStrFixedCount = 3;
    someStrings[0] = "A";
    someStrings[1] = "B";
    someStrings[2] = "C";
    theStruct.StrArray = someStrings;
    theStruct.StrArrayCount = 3;

    JL_ASSERT_SUCCESS( MakeJsonAndVerify( &theStruct, marshalStringStruct, NumElements(marshalStringStruct),
                                          "{\"ArrayStrFixed\":[\"a\",\"b\",\"c\"],\"StrArray\":[\"A\",\"B\",\"C\"]}" ) );

    return TestReturn;
}